

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateCachedTypeWithoutPropertyCheck
          (Lowerer *this,Instr *instrInsert,PropertySymOpnd *propertySymOpnd,Opnd *typeOpnd,
          LabelInstr *labelTypeCheckFailed)

{
  code *pcVar1;
  JITTypeHolderBase<void> type;
  bool bVar2;
  TypeId typeId;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  JITType *pJVar7;
  RegOpnd *baseOpnd;
  IndirOpnd *src;
  Lowerer *this_00;
  AddrOpnd *compareSrc2;
  JITTimeFunctionBody *pJVar8;
  FunctionJITTimeInfo *this_01;
  intptr_t iVar9;
  PropertySym *pPVar10;
  WCHAR local_458 [4];
  WCHAR prefixValue [512];
  JITTypeHolderBase<void> local_40;
  JITTypeHolder typeWithoutProperty;
  
  bVar2 = IR::PropertySymOpnd::IsMonoObjTypeSpecCandidate(propertySymOpnd);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1e9c,"(propertySymOpnd->IsMonoObjTypeSpecCandidate())",
                       "propertySymOpnd->IsMonoObjTypeSpecCandidate()");
    if (!bVar2) goto LAB_0056bcf4;
    *puVar6 = 0;
  }
  bVar2 = IR::PropertySymOpnd::HasInitialType(propertySymOpnd);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1e9d,"(propertySymOpnd->HasInitialType())",
                       "propertySymOpnd->HasInitialType()");
    if (!bVar2) goto LAB_0056bcf4;
    *puVar6 = 0;
  }
  local_40.t = (Type)IR::PropertySymOpnd::GetInitialType(propertySymOpnd);
  pJVar7 = JITTypeHolderBase<void>::operator->(&local_40);
  typeId = JITType::GetTypeId(pJVar7);
  bVar2 = Js::DynamicType::Is(typeId);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ea2,"(Js::DynamicType::Is(typeWithoutProperty->GetTypeId()))",
                       "Js::DynamicType::Is(typeWithoutProperty->GetTypeId())");
    if (!bVar2) {
LAB_0056bcf4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  if (typeOpnd == (Opnd *)0x0) {
    baseOpnd = IR::SymOpnd::CreatePropertyOwnerOpnd(&propertySymOpnd->super_SymOpnd,this->m_func);
    bVar2 = IR::Opnd::IsNotTaggedValue(&baseOpnd->super_Opnd);
    if (!bVar2) {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&baseOpnd->super_Opnd,instrInsert,labelTypeCheckFailed,false);
    }
    src = IR::IndirOpnd::New(baseOpnd,8,TyInt64,this->m_func,false);
    typeOpnd = &IR::RegOpnd::New(TyInt64,this->m_func)->super_Opnd;
    InsertMove(typeOpnd,&src->super_Opnd,instrInsert,true);
  }
  this_00 = (Lowerer *)
            CreateTypePropertyGuardForGuardedProperties
                      (this,(JITTypeHolder)local_40.t,propertySymOpnd);
  if (this_00 == (Lowerer *)0x0) {
    pJVar7 = JITTypeHolderBase<void>::operator->(&local_40);
    this_00 = (Lowerer *)JITType::GetAddr(pJVar7);
    compareSrc2 = IR::AddrOpnd::New((intptr_t)this_00,AddrOpndKindDynamicType,this->m_func,true,
                                    (Var)0x0);
  }
  else {
    compareSrc2 = (AddrOpnd *)
                  IR::MemRefOpnd::New(this_00,TyUint64,this->m_func,AddrOpndKindDynamicGuardValueRef
                                     );
    if (DAT_0145948a == '\x01') {
      typeWithoutProperty.t = (Type)labelTypeCheckFailed;
      uVar3 = Func::GetSourceContextId(this->m_func);
      uVar4 = Func::GetLocalFunctionId(this->m_func);
      this_00 = (Lowerer *)&DAT_01453738;
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar3,uVar4);
      labelTypeCheckFailed = (LabelInstr *)typeWithoutProperty;
      if (bVar2) {
        pJVar8 = Func::GetJITFunctionBody(this->m_func);
        prefixValue._1016_8_ = JITTimeFunctionBody::GetDisplayName(pJVar8);
        pJVar8 = Func::GetJITFunctionBody(this->m_func);
        uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
        this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
        pJVar8 = Func::GetJITFunctionBody(this->m_func);
        uVar5 = JITTimeFunctionBody::GetFunctionNumber(pJVar8);
        swprintf_s<512ul>((WCHAR (*) [512])local_458,L"%s (#%d.%u, #%u)",prefixValue._1016_8_,
                          (ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
        pJVar7 = JITTypeHolderBase<void>::operator->(&local_40);
        iVar9 = JITType::GetAddr(pJVar7);
        this_00 = (Lowerer *)0x84;
        Output::TraceWithPrefix
                  (ObjTypeSpecPhase,local_458,L"Emitted %s type check for type 0x%p.\n",L"indirect",
                   iVar9);
        labelTypeCheckFailed = (LabelInstr *)typeWithoutProperty;
      }
    }
  }
  InsertCompareBranch(this_00,typeOpnd,&compareSrc2->super_Opnd,BrNeq_A,labelTypeCheckFailed,
                      instrInsert,false);
  type.t = (Type)local_40;
  pPVar10 = Sym::AsPropertySym((propertySymOpnd->super_SymOpnd).m_sym);
  PinTypeRef(this,(JITTypeHolder)type.t,type.t,instrInsert,pPVar10->m_propertyId);
  return;
}

Assistant:

void
Lowerer::GenerateCachedTypeWithoutPropertyCheck(IR::Instr *instrInsert, IR::PropertySymOpnd *propertySymOpnd, IR::Opnd *typeOpnd, IR::LabelInstr *labelTypeCheckFailed)
{
    Assert(propertySymOpnd->IsMonoObjTypeSpecCandidate());
    Assert(propertySymOpnd->HasInitialType());

    JITTypeHolder typeWithoutProperty = propertySymOpnd->GetInitialType();

    // We should never add properties to objects of static types.
    Assert(Js::DynamicType::Is(typeWithoutProperty->GetTypeId()));

    if (typeOpnd == nullptr)
    {
        // No opnd holding the type was passed in, so we have to load the type here.
        IR::RegOpnd *baseOpnd = propertySymOpnd->CreatePropertyOwnerOpnd(m_func);
        if (!baseOpnd->IsNotTaggedValue())
        {
            m_lowererMD.GenerateObjectTest(baseOpnd, instrInsert, labelTypeCheckFailed);
        }
        IR::Opnd *opnd = IR::IndirOpnd::New(baseOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
        typeOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
        InsertMove(typeOpnd, opnd, instrInsert);
    }

    Js::JitTypePropertyGuard* typePropertyGuard = CreateTypePropertyGuardForGuardedProperties(typeWithoutProperty, propertySymOpnd);

    IR::Opnd *expectedTypeOpnd;

    if (typePropertyGuard)
    {
        bool emitDirectCheck = true;

        Assert(typePropertyGuard != nullptr);
        Assert(Js::PropertyGuard::GetSizeOfValue() == static_cast<size_t>(TySize[TyMachPtr]));

        if (this->m_func->IsOOPJIT())
        {
            int typeCheckGuardOffset = NativeCodeData::GetDataTotalOffset(typePropertyGuard);
            expectedTypeOpnd = IR::IndirOpnd::New(IR::RegOpnd::New(m_func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), typeCheckGuardOffset, TyMachPtr,
#if DBG
                NativeCodeData::GetDataDescription(typePropertyGuard, this->m_func->m_alloc),
#endif
                this->m_func, true);

            this->addToLiveOnBackEdgeSyms->Set(m_func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            expectedTypeOpnd = IR::MemRefOpnd::New((void*)(typePropertyGuard->GetAddressOfValue()), TyMachPtr, this->m_func, IR::AddrOpndKindDynamicGuardValueRef);
        }

        emitDirectCheck = false;

        OUTPUT_VERBOSE_TRACE_FUNC(Js::ObjTypeSpecPhase, this->m_func, _u("Emitted %s type check for type 0x%p.\n"),
            emitDirectCheck ? _u("direct") : _u("indirect"), typeWithoutProperty->GetAddr());
    }
    else
    {
        expectedTypeOpnd = IR::AddrOpnd::New(typeWithoutProperty->GetAddr(), IR::AddrOpndKindDynamicType, m_func, true);
    }

    InsertCompareBranch(typeOpnd, expectedTypeOpnd, Js::OpCode::BrNeq_A, labelTypeCheckFailed, instrInsert);

    // Technically, it should be enough to pin the final type, because it should keep all of its predecessors alive, but
    // just to be extra cautious, let's pin the initial type as well.
    PinTypeRef(typeWithoutProperty, typeWithoutProperty.t, instrInsert, propertySymOpnd->m_sym->AsPropertySym()->m_propertyId);
}